

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,char *name,char *str)

{
  ostream *poVar1;
  
  tab(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,">\"");
  poVar1 = std::operator<<(poVar1,str);
  poVar1 = std::operator<<(poVar1,"\"</");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void XMLWriter::store(const char* name, const char* str) {
    tab(); xml << "<" << name << ">\"" << str << "\"</" << name << ">" << std::endl;
  }